

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

uint statehash(config *a)

{
  uint local_14;
  config *pcStack_10;
  uint h;
  config *a_local;
  
  local_14 = 0;
  for (pcStack_10 = a; pcStack_10 != (config *)0x0; pcStack_10 = pcStack_10->bp) {
    local_14 = local_14 * 0x23b + pcStack_10->rp->index * 0x25 + pcStack_10->dot;
  }
  return local_14;
}

Assistant:

PRIVATE unsigned statehash(struct config *a)
{
  unsigned h=0;
  while( a ){
    h = h*571 + a->rp->index*37 + a->dot;
    a = a->bp;
  }
  return h;
}